

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSourceFileLocation.cxx
# Opt level: O2

void __thiscall
cmSourceFileLocation::cmSourceFileLocation
          (cmSourceFileLocation *this,cmMakefile *mf,string *name,cmSourceFileLocationKind kind)

{
  string *in_name;
  bool bVar1;
  string local_50;
  
  this->Makefile = mf;
  this->AmbiguousDirectory = true;
  this->AmbiguousExtension = true;
  in_name = &this->Directory;
  (this->Directory)._M_dataplus._M_p = (pointer)&(this->Directory).field_2;
  (this->Directory)._M_string_length = 0;
  (this->Directory).field_2._M_local_buf[0] = '\0';
  (this->Name)._M_dataplus._M_p = (pointer)&(this->Name).field_2;
  (this->Name)._M_string_length = 0;
  (this->Name).field_2._M_local_buf[0] = '\0';
  bVar1 = cmsys::SystemTools::FileIsFullPath(name);
  this->AmbiguousDirectory = !bVar1;
  this->AmbiguousExtension = true;
  cmsys::SystemTools::GetFilenamePath(&local_50,name);
  std::__cxx11::string::operator=((string *)in_name,(string *)&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  bVar1 = cmsys::SystemTools::FileIsFullPath(in_name);
  if (bVar1) {
    cmsys::SystemTools::CollapseFullPath(&local_50,in_name);
    std::__cxx11::string::operator=((string *)in_name,(string *)&local_50);
    std::__cxx11::string::~string((string *)&local_50);
  }
  cmsys::SystemTools::GetFilenameName(&local_50,name);
  std::__cxx11::string::operator=((string *)&this->Name,(string *)&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  if (kind == Known) {
    DirectoryUseSource(this);
    this->AmbiguousExtension = false;
  }
  else {
    UpdateExtension(this,name);
  }
  return;
}

Assistant:

cmSourceFileLocation::cmSourceFileLocation(cmMakefile const* mf,
                                           const std::string& name,
                                           cmSourceFileLocationKind kind)
  : Makefile(mf)
{
  this->AmbiguousDirectory = !cmSystemTools::FileIsFullPath(name);
  this->AmbiguousExtension = true;
  this->Directory = cmSystemTools::GetFilenamePath(name);
  if (cmSystemTools::FileIsFullPath(this->Directory)) {
    this->Directory = cmSystemTools::CollapseFullPath(this->Directory);
  }
  this->Name = cmSystemTools::GetFilenameName(name);
  if (kind == cmSourceFileLocationKind::Known) {
    this->DirectoryUseSource();
    this->AmbiguousExtension = false;
  } else {
    this->UpdateExtension(name);
  }
}